

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

bool __thiscall nonius::detail::option::matches_long(option *this,string *s,string *arg)

{
  _Alloc_hider local_28;
  char local_20;
  
  long_separator((option *)&stack0xffffffffffffffd8,&this->long_form);
  if ((local_20 == '\x01') && ((s->_M_dataplus)._M_p + s->_M_string_length != local_28._M_p)) {
    if (*local_28._M_p == '=') {
      std::__cxx11::string::replace
                ((ulong)arg,0,(char *)arg->_M_string_length,(ulong)(local_28._M_p + 1));
    }
    else {
      local_20 = '\0';
    }
  }
  return (bool)local_20;
}

Assistant:

bool matches_long(std::string const& s, std::string& arg) const {
                bool match; std::string::const_iterator it;
                std::tie(match, it) = long_separator(s);
                if(match && it != s.end()) {
                    if(*it == '=') arg.assign(it+1, s.end());
                    else return false;
                }
                return match;
            }